

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall re2::BitState::TrySearch(BitState *this,int id0,char *p0)

{
  bool bVar1;
  bool bVar2;
  InstOp IVar3;
  int iVar4;
  EmptyOp EVar5;
  int iVar6;
  const_pointer pcVar7;
  size_type sVar8;
  LogMessage *pLVar9;
  Job *pJVar10;
  Inst *pIVar11;
  char **ppcVar12;
  ostream *poVar13;
  undefined8 *puVar14;
  int *piVar15;
  long in_RDI;
  int i;
  int c;
  Inst *ip;
  char *p;
  int *rle;
  int id;
  char *end;
  bool matched;
  char *in_stack_fffffffffffffd68;
  Prog *in_stack_fffffffffffffd70;
  const_pointer in_stack_fffffffffffffd78;
  LogMessage *in_stack_fffffffffffffd80;
  LogMessage *in_stack_fffffffffffffd88;
  EmptyOp in_stack_fffffffffffffd94;
  Prog *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  char *in_stack_fffffffffffffda8;
  LogMessage *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdc8;
  StringPiece *in_stack_fffffffffffffdd0;
  StringPiece local_1f8;
  int local_1e4;
  uint local_1e0;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  BitState *in_stack_ffffffffffffff70;
  LogMessage *local_48;
  int local_34;
  
  bVar1 = false;
  pcVar7 = StringPiece::data((StringPiece *)(in_RDI + 8));
  sVar8 = StringPiece::size((StringPiece *)(in_RDI + 8));
  pLVar9 = (LogMessage *)(pcVar7 + sVar8);
  *(undefined4 *)(in_RDI + 0x70) = 0;
  bVar2 = ShouldVisit((BitState *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                      &in_stack_fffffffffffffd88->flushed_);
  if (bVar2) {
    Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
  }
LAB_0022a8d5:
  while( true ) {
    if (*(int *)(in_RDI + 0x70) < 1) {
      return bVar1;
    }
    *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + -1;
    pJVar10 = PODArray<re2::Job>::operator[]
                        ((PODArray<re2::Job> *)in_stack_fffffffffffffd70,
                         (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_34 = pJVar10->id;
    pJVar10 = PODArray<re2::Job>::operator[]
                        ((PODArray<re2::Job> *)in_stack_fffffffffffffd70,
                         (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    piVar15 = &pJVar10->rle;
    pJVar10 = PODArray<re2::Job>::operator[]
                        ((PODArray<re2::Job> *)in_stack_fffffffffffffd70,
                         (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_48 = (LogMessage *)pJVar10->p;
    if (-1 < local_34) break;
    pIVar11 = Prog::inst(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    Prog::Inst::cap(pIVar11);
    ppcVar12 = PODArray<const_char_*>::operator[]
                         ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,
                          (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    *ppcVar12 = (char *)local_48;
  }
  if (0 < *piVar15) {
    local_48 = (LogMessage *)(&local_48->flushed_ + *piVar15);
    *piVar15 = *piVar15 + -1;
    *(int *)(in_RDI + 0x70) = *(int *)(in_RDI + 0x70) + 1;
  }
LAB_0022aa14:
  pIVar11 = Prog::inst(in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  IVar3 = Prog::Inst::opcode(pIVar11);
  switch(IVar3) {
  case kInstAltMatch:
    bVar2 = Prog::Inst::greedy((Inst *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)
                               ,in_stack_fffffffffffffd98);
    if (bVar2) {
      local_34 = Prog::Inst::out1(pIVar11);
      local_48 = pLVar9;
      goto LAB_0022aa14;
    }
    if ((*(byte *)(in_RDI + 0x29) & 1) != 0) {
      local_34 = Prog::Inst::out(pIVar11);
      local_48 = pLVar9;
      goto LAB_0022aa14;
    }
    break;
  case kInstByteRange:
    local_1e0 = 0xffffffff;
    if (local_48 < pLVar9) {
      local_1e0 = (uint)local_48->flushed_;
    }
    bVar2 = Prog::Inst::Matches((Inst *)in_stack_fffffffffffffd80,
                                (int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    if (bVar2) {
      iVar6 = Prog::Inst::hint(pIVar11);
      if (iVar6 != 0) {
        Prog::Inst::hint(pIVar11);
        Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      }
      local_34 = Prog::Inst::out(pIVar11);
      local_48 = (LogMessage *)&local_48->field_0x1;
      goto LAB_0022ae40;
    }
    break;
  case kInstCapture:
    iVar6 = Prog::Inst::last(pIVar11);
    if (iVar6 == 0) {
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
    }
    iVar6 = Prog::Inst::cap(pIVar11);
    if (-1 < iVar6) {
      iVar6 = Prog::Inst::cap(pIVar11);
      iVar4 = PODArray<const_char_*>::size((PODArray<const_char_*> *)0x22acc4);
      if (iVar6 < iVar4) {
        in_stack_fffffffffffffda4 = -local_34;
        in_stack_fffffffffffffd98 = (Prog *)(in_RDI + 0x50);
        Prog::Inst::cap(pIVar11);
        PODArray<const_char_*>::operator[]
                  ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,
                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
        in_stack_fffffffffffffda8 = (char *)(in_RDI + 0x50);
        in_stack_fffffffffffffdb0 = local_48;
        Prog::Inst::cap(pIVar11);
        ppcVar12 = PODArray<const_char_*>::operator[]
                             ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,
                              (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        *ppcVar12 = &in_stack_fffffffffffffdb0->flushed_;
      }
    }
    local_34 = Prog::Inst::out(pIVar11);
    goto LAB_0022ae40;
  case kInstEmptyWidth:
    in_stack_fffffffffffffd94 = Prog::Inst::empty(pIVar11);
    EVar5 = Prog::EmptyFlags(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if ((in_stack_fffffffffffffd94 & (EVar5 ^ 0xffffffff)) == 0) {
      iVar6 = Prog::Inst::last(pIVar11);
      if (iVar6 == 0) {
        Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      }
      local_34 = Prog::Inst::out(pIVar11);
      goto LAB_0022ae40;
    }
    break;
  case kInstMatch:
    if (((*(byte *)(in_RDI + 0x2a) & 1) == 0) || (local_48 == pLVar9)) {
      if (*(int *)(in_RDI + 0x38) == 0) {
        return true;
      }
      bVar1 = true;
      in_stack_fffffffffffffd88 = local_48;
      ppcVar12 = PODArray<const_char_*>::operator[]
                           ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,
                            (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
      *ppcVar12 = &in_stack_fffffffffffffd88->flushed_;
      pcVar7 = StringPiece::data(*(StringPiece **)(in_RDI + 0x30));
      if (pcVar7 == (const_pointer)0x0) {
LAB_0022af5b:
        for (local_1e4 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
            local_1e4 < *(int *)(in_RDI + 0x38); local_1e4 = local_1e4 + 1) {
          ppcVar12 = PODArray<const_char_*>::operator[]
                               ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,iVar6);
          in_stack_fffffffffffffd70 = (Prog *)*ppcVar12;
          ppcVar12 = PODArray<const_char_*>::operator[]
                               ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,iVar6);
          in_stack_fffffffffffffd68 = *ppcVar12;
          ppcVar12 = PODArray<const_char_*>::operator[]
                               ((PODArray<const_char_*> *)in_stack_fffffffffffffd70,
                                (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
          StringPiece::StringPiece
                    (&local_1f8,&in_stack_fffffffffffffd70->anchor_start_,
                     (long)in_stack_fffffffffffffd68 - (long)*ppcVar12);
          puVar14 = (undefined8 *)(*(long *)(in_RDI + 0x30) + (long)local_1e4 * 0x10);
          *puVar14 = local_1f8.data_;
          puVar14[1] = local_1f8.size_;
        }
      }
      else if ((*(byte *)(in_RDI + 0x29) & 1) != 0) {
        in_stack_fffffffffffffd80 = local_48;
        in_stack_fffffffffffffd78 = StringPiece::data(*(StringPiece **)(in_RDI + 0x30));
        sVar8 = StringPiece::size(*(StringPiece **)(in_RDI + 0x30));
        if ((LogMessage *)(in_stack_fffffffffffffd78 + sVar8) < in_stack_fffffffffffffd80)
        goto LAB_0022af5b;
      }
      if ((*(byte *)(in_RDI + 0x29) & 1) == 0) {
        return true;
      }
      if (local_48 == pLVar9) {
        return true;
      }
    }
    break;
  case kInstNop:
    iVar6 = Prog::Inst::last(pIVar11);
    if (iVar6 == 0) {
      Push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
    }
    local_34 = Prog::Inst::out(pIVar11);
LAB_0022ae40:
    bVar2 = ShouldVisit((BitState *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,
                        &in_stack_fffffffffffffd88->flushed_);
    if (!bVar2) goto LAB_0022a8d5;
    goto LAB_0022aa14;
  case kInstFail:
    goto LAB_0022a8d5;
  default:
    pLVar9 = (LogMessage *)&stack0xfffffffffffffe30;
    LogMessage::LogMessage
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
    poVar13 = LogMessage::stream(pLVar9);
    poVar13 = std::operator<<(poVar13,"Unexpected opcode: ");
    IVar3 = Prog::Inst::opcode(pIVar11);
    std::ostream::operator<<(poVar13,IVar3);
    LogMessage::~LogMessage(in_stack_fffffffffffffd80);
    return false;
  }
  iVar6 = Prog::Inst::last(pIVar11);
  if (iVar6 != 0) goto LAB_0022a8d5;
  local_34 = local_34 + 1;
  goto LAB_0022aa14;
}

Assistant:

bool BitState::TrySearch(int id0, const char* p0) {
  bool matched = false;
  const char* end = text_.data() + text_.size();
  njob_ = 0;
  // Push() no longer checks ShouldVisit(),
  // so we must perform the check ourselves.
  if (ShouldVisit(id0, p0))
    Push(id0, p0);
  while (njob_ > 0) {
    // Pop job off stack.
    --njob_;
    int id = job_[njob_].id;
    int& rle = job_[njob_].rle;
    const char* p = job_[njob_].p;

    if (id < 0) {
      // Undo the Capture.
      cap_[prog_->inst(-id)->cap()] = p;
      continue;
    }

    if (rle > 0) {
      p += rle;
      // Revivify job on stack.
      --rle;
      ++njob_;
    }

  Loop:
    // Visit id, p.
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "Unexpected opcode: " << ip->opcode();
        return false;

      case kInstFail:
        break;

      case kInstAltMatch:
        if (ip->greedy(prog_)) {
          // out1 is the Match instruction.
          id = ip->out1();
          p = end;
          goto Loop;
        }
        if (longest_) {
          // ip must be non-greedy...
          // out is the Match instruction.
          id = ip->out();
          p = end;
          goto Loop;
        }
        goto Next;

      case kInstByteRange: {
        int c = -1;
        if (p < end)
          c = *p & 0xFF;
        if (!ip->Matches(c))
          goto Next;

        if (ip->hint() != 0)
          Push(id+ip->hint(), p);  // try the next when we're done
        id = ip->out();
        p++;
        goto CheckAndLoop;
      }

      case kInstCapture:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done

        if (0 <= ip->cap() && ip->cap() < cap_.size()) {
          // Capture p to register, but save old value first.
          Push(-id, cap_[ip->cap()]);  // undo when we're done
          cap_[ip->cap()] = p;
        }

        id = ip->out();
        goto CheckAndLoop;

      case kInstEmptyWidth:
        if (ip->empty() & ~Prog::EmptyFlags(context_, p))
          goto Next;

        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();
        goto CheckAndLoop;

      case kInstNop:
        if (!ip->last())
          Push(id+1, p);  // try the next when we're done
        id = ip->out();

      CheckAndLoop:
        // Sanity check: id is the head of its list, which must
        // be the case if id-1 is the last of *its* list. :)
        DCHECK(id == 0 || prog_->inst(id-1)->last());
        if (ShouldVisit(id, p))
          goto Loop;
        break;

      case kInstMatch: {
        if (endmatch_ && p != end)
          goto Next;

        // We found a match.  If the caller doesn't care
        // where the match is, no point going further.
        if (nsubmatch_ == 0)
          return true;

        // Record best match so far.
        // Only need to check end point, because this entire
        // call is only considering one start position.
        matched = true;
        cap_[1] = p;
        if (submatch_[0].data() == NULL ||
            (longest_ && p > submatch_[0].data() + submatch_[0].size())) {
          for (int i = 0; i < nsubmatch_; i++)
            submatch_[i] =
                StringPiece(cap_[2 * i],
                            static_cast<size_t>(cap_[2 * i + 1] - cap_[2 * i]));
        }

        // If going for first match, we're done.
        if (!longest_)
          return true;

        // If we used the entire text, no longer match is possible.
        if (p == end)
          return true;

        // Otherwise, continue on in hope of a longer match.
        // Note the absence of the ShouldVisit() check here
        // due to execution remaining in the same list.
      Next:
        if (!ip->last()) {
          id++;
          goto Loop;
        }
        break;
      }
    }
  }
  return matched;
}